

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::write_decimal<int>
          (basic_writer<fmt::v6::buffer_range<char>_> *this,int value)

{
  buffer<char> *pbVar1;
  size_t sVar2;
  undefined1 *puVar3;
  byte bVar4;
  long lVar5;
  uint uVar6;
  ptrdiff_t _Num;
  ulong __n;
  uint uVar7;
  ulong uVar8;
  char *__dest;
  ulong uVar9;
  char buffer [20];
  undefined1 auStack_48 [24];
  
  uVar8 = (ulong)(uint)-value;
  if (0 < value) {
    uVar8 = (ulong)(uint)value;
  }
  uVar7 = (uint)uVar8;
  uVar6 = 0x1f;
  if ((uVar7 | 1) != 0) {
    for (; (uVar7 | 1) >> uVar6 == 0; uVar6 = uVar6 - 1) {
    }
  }
  uVar6 = (uVar6 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  __n = (ulong)((uVar6 - (uVar7 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32 +
                                           (ulong)uVar6 * 4))) + 1);
  pbVar1 = (this->out_).container;
  sVar2 = pbVar1->size_;
  uVar9 = ((uint)value >> 0x1f) + sVar2 + __n;
  if (pbVar1->capacity_ < uVar9) {
    (**pbVar1->_vptr_buffer)(pbVar1,uVar9);
  }
  __dest = pbVar1->ptr_ + sVar2;
  pbVar1->size_ = uVar9;
  if (value < 0) {
    *__dest = '-';
    __dest = __dest + 1;
  }
  puVar3 = auStack_48 + __n;
  if (99 < uVar7) {
    do {
      uVar6 = (uint)uVar8;
      uVar7 = (uint)(uVar8 / 100);
      uVar8 = uVar8 / 100;
      *(undefined2 *)(puVar3 + -2) =
           *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar6 + (int)uVar8 * -100) * 2);
      puVar3 = puVar3 + -2;
    } while (9999 < uVar6);
  }
  if (uVar7 < 10) {
    bVar4 = (byte)uVar7 | 0x30;
    lVar5 = -1;
  }
  else {
    puVar3[-1] = basic_data<void>::digits[((ulong)uVar7 * 2 & 0xffffffff) + 1];
    bVar4 = basic_data<void>::digits[(ulong)uVar7 * 2];
    lVar5 = -2;
  }
  puVar3[lVar5] = bVar4;
  if (__n != 0) {
    memcpy(__dest,auStack_48,__n);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }